

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void DCCorrection(double *input,double f0,int fs,int fft_size,double *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ulong uVar5;
  double *yi;
  double *xi;
  int local_4c;
  int i_1;
  int upper_limit_replica;
  int i;
  double *low_frequency_axis;
  double *low_frequency_replica;
  int upper_limit;
  double *output_local;
  int fft_size_local;
  int fs_local;
  double f0_local;
  double *input_local;
  
  iVar3 = (int)((f0 * (double)fft_size) / (double)fs);
  iVar4 = iVar3 + 2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  yi = (double *)operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar5);
  for (i_1 = 0; i_1 < iVar4; i_1 = i_1 + 1) {
    xi[i_1] = ((double)i_1 * (double)fs) / (double)fft_size;
  }
  interp1Q(f0 - *xi,-(double)fs / (double)fft_size,input,iVar3 + 3,xi,iVar3 + 1,yi);
  for (local_4c = 0; local_4c < iVar3 + 1; local_4c = local_4c + 1) {
    output[local_4c] = input[local_4c] + yi[local_4c];
  }
  if (yi != (double *)0x0) {
    operator_delete__(yi);
  }
  if (xi != (double *)0x0) {
    operator_delete__(xi);
  }
  return;
}

Assistant:

void DCCorrection(const double *input, double f0, int fs, int fft_size,
    double *output) {
  int upper_limit = 2 + static_cast<int>(f0 * fft_size / fs);
  double *low_frequency_replica = new double[upper_limit];
  double *low_frequency_axis = new double[upper_limit];

  for (int i = 0; i < upper_limit; ++i)
    low_frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  int upper_limit_replica = upper_limit - 1;
  interp1Q(f0 - low_frequency_axis[0],
      -static_cast<double>(fs) / fft_size, input, upper_limit + 1,
      low_frequency_axis, upper_limit_replica, low_frequency_replica);

  for (int i = 0; i < upper_limit_replica; ++i)
    output[i] = input[i] + low_frequency_replica[i];

  delete[] low_frequency_replica;
  delete[] low_frequency_axis;
}